

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O2

void __thiscall Assimp::Ogre::Skeleton::Reset(Skeleton *this)

{
  pointer ppBVar1;
  Bone *this_00;
  pointer ppAVar2;
  Animation *this_01;
  BoneList *__range2;
  Animation **anim;
  pointer ppAVar3;
  Bone **bone;
  pointer ppBVar4;
  
  ppBVar1 = (this->bones).
            super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppBVar4 = (this->bones).
                 super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppBVar4 != ppBVar1; ppBVar4 = ppBVar4 + 1
      ) {
    this_00 = *ppBVar4;
    if (this_00 != (Bone *)0x0) {
      Bone::~Bone(this_00);
    }
    operator_delete(this_00,0xf8);
    *ppBVar4 = (Bone *)0x0;
  }
  ppBVar4 = (this->bones).
            super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->bones).super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppBVar4) {
    (this->bones).super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppBVar4;
  }
  ppAVar2 = (this->animations).
            super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppAVar3 = (this->animations).
                 super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppAVar3 != ppAVar2;
      ppAVar3 = ppAVar3 + 1) {
    this_01 = *ppAVar3;
    if (this_01 != (Animation *)0x0) {
      Animation::~Animation(this_01);
    }
    operator_delete(this_01,0x70);
    *ppAVar3 = (Animation *)0x0;
  }
  ppAVar3 = (this->animations).
            super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->animations).
      super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppAVar3) {
    (this->animations).
    super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppAVar3;
  }
  return;
}

Assistant:

void Skeleton::Reset()
{
    for(auto &bone : bones) {
        OGRE_SAFE_DELETE(bone)
    }
    bones.clear();
    for(auto &anim : animations) {
        OGRE_SAFE_DELETE(anim)
    }
    animations.clear();
}